

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_stat.cpp
# Opt level: O0

void __thiscall csv::CSVStat::min_max(CSVStat *this,longdouble *x_n,size_t *i)

{
  longdouble lVar1;
  uint uVar2;
  reference pvVar3;
  double __value;
  double __value_00;
  size_t *i_local;
  longdouble *x_n_local;
  CSVStat *this_local;
  
  std::vector<long_double,_std::allocator<long_double>_>::operator[](&this->mins,*i);
  uVar2 = std::isnan(__value);
  if ((uVar2 & 1) != 0) {
    lVar1 = *x_n;
    pvVar3 = std::vector<long_double,_std::allocator<long_double>_>::operator[](&this->mins,*i);
    *(longdouble *)pvVar3 = lVar1;
  }
  std::vector<long_double,_std::allocator<long_double>_>::operator[](&this->maxes,*i);
  uVar2 = std::isnan(__value_00);
  if ((uVar2 & 1) != 0) {
    lVar1 = *x_n;
    pvVar3 = std::vector<long_double,_std::allocator<long_double>_>::operator[](&this->maxes,*i);
    *(longdouble *)pvVar3 = lVar1;
  }
  lVar1 = *x_n;
  pvVar3 = std::vector<long_double,_std::allocator<long_double>_>::operator[](&this->mins,*i);
  if (*(longdouble *)pvVar3 <= lVar1) {
    lVar1 = *x_n;
    pvVar3 = std::vector<long_double,_std::allocator<long_double>_>::operator[](&this->maxes,*i);
    if (*(longdouble *)pvVar3 < lVar1) {
      lVar1 = *x_n;
      pvVar3 = std::vector<long_double,_std::allocator<long_double>_>::operator[](&this->maxes,*i);
      *(longdouble *)pvVar3 = lVar1;
    }
  }
  else {
    lVar1 = *x_n;
    pvVar3 = std::vector<long_double,_std::allocator<long_double>_>::operator[](&this->mins,*i);
    *(longdouble *)pvVar3 = lVar1;
  }
  return;
}

Assistant:

CSV_INLINE void CSVStat::min_max(const long double &x_n, const size_t &i) {
        /** Update current minimum and maximum
         *  @param[in]  x_n Data observation
         *  @param[out] i   The column index that should be updated
         */
        if (std::isnan(this->mins[i]))
            this->mins[i] = x_n;
        if (std::isnan(this->maxes[i]))
            this->maxes[i] = x_n;
        
        if (x_n < this->mins[i])
            this->mins[i] = x_n;
        else if (x_n > this->maxes[i])
            this->maxes[i] = x_n;
    }